

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatf>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,quatf *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 local_5d;
  undefined8 uStack_55;
  optional<tinyusdz::value::quatf> local_4c;
  undefined8 local_35;
  undefined8 uStack_2d;
  
  if (v == (quatf *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::quatf>(&local_4c,this);
    if (local_4c.has_value_ == true) {
      local_35 = local_4c.contained._0_8_;
      uStack_2d = local_4c.contained._8_8_;
      local_5d = local_4c.contained._0_8_;
      uStack_55 = local_4c.contained._8_8_;
    }
    if (local_4c.has_value_ != false) goto LAB_0039ba33;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::quatf,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))) {
    get_value<tinyusdz::value::quatf>(&local_4c,this);
    if (local_4c.has_value_ == true) {
      local_5d = local_4c.contained._0_8_;
      uStack_55 = local_4c.contained._8_8_;
    }
    if (local_4c.has_value_ != false) {
LAB_0039ba33:
      *(undefined8 *)(v->imag)._M_elems = local_5d;
      *(undefined8 *)((v->imag)._M_elems + 2) = uStack_55;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }